

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMacro.h
# Opt level: O3

void __thiscall CMacro::~CMacro(CMacro *this)

{
  pointer pwVar1;
  
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector(&this->arguments);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector(&this->lines);
  pwVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)pwVar1 != &(this->name).field_2) {
    operator_delete(pwVar1);
    return;
  }
  return;
}

Assistant:

CMacro(void) { counter = 0; }